

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::CPattern::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,CPattern *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdNotify *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdMissing *this_04;
  MthdCtxFormat *this_05;
  MthdBitmapFormat *this_06;
  MthdPatternShape *this_07;
  MthdPatternSelect *this_08;
  MthdPatternBitmapColor *pMVar2;
  MthdPatternBitmap *pMVar3;
  MthdPatternColorY8 *this_09;
  MthdPatternColorR5G6B5 *this_10;
  MthdPatternColorR5G5B5 *this_11;
  MthdPatternColorR8G8B8 *this_12;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_363;
  undefined1 local_362;
  allocator local_361;
  string local_360 [38];
  undefined1 local_33a;
  allocator local_339;
  string local_338 [38];
  undefined1 local_312;
  allocator local_311;
  string local_310 [38];
  undefined1 local_2ea;
  allocator local_2e9;
  string local_2e8 [38];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [38];
  undefined1 local_29a;
  allocator local_299;
  string local_298 [38];
  undefined1 local_272;
  allocator local_271;
  string local_270 [38];
  undefined1 local_24a;
  allocator local_249;
  string local_248 [38];
  undefined1 local_222;
  allocator local_221;
  string local_220 [38];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [38];
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [38];
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [38];
  undefined1 local_182;
  allocator local_181;
  string local_180 [38];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [48];
  SingleMthdTest *local_b0;
  MthdNotify *local_a8;
  MthdPmTrigger *local_a0;
  MthdDmaNotify *local_98;
  MthdMissing *local_90;
  MthdCtxFormat *local_88;
  MthdBitmapFormat *local_80;
  MthdPatternShape *local_78;
  MthdPatternSelect *local_70;
  MthdPatternBitmapColor *local_68;
  MthdPatternBitmapColor *local_60;
  MthdPatternBitmap *local_58;
  MthdPatternBitmap *local_50;
  MthdPatternColorY8 *local_48;
  MthdPatternColorR5G6B5 *local_40;
  MthdPatternColorR5G5B5 *local_38;
  MthdPatternColorR8G8B8 *local_30;
  iterator local_28;
  size_type local_20;
  CPattern *local_18;
  CPattern *this_local;
  
  local_18 = this;
  this_local = (CPattern *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_e2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"nop",&local_e1);
  MthdNop::SingleMthdTest
            ((MthdNop *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_e0,-1,
             (this->super_Class).cls,0x100,1,4);
  local_e2 = 0;
  local_b0 = this_00;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_10a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"notify",&local_109);
  MthdNotify::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_108,0,
             (this->super_Class).cls,0x104,1,4);
  local_10a = 0;
  local_a8 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_132 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"pm_trigger",&local_131);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_130,-1,
             (this->super_Class).cls,0x140,1,4);
  local_132 = 0;
  local_a0 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_15a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"dma_notify",&local_159);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_158,1,
             (this->super_Class).cls,0x180,1,4);
  local_15a = 0;
  local_98 = this_03;
  this_04 = (MthdMissing *)operator_new(0x25950);
  local_182 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"missing",&local_181);
  MthdMissing::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_180,-1,
             (this->super_Class).cls,0x200,1,4);
  local_182 = 0;
  local_90 = this_04;
  this_05 = (MthdCtxFormat *)operator_new(0x25950);
  local_1aa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"format",&local_1a9);
  MthdCtxFormat::SingleMthdTest
            (this_05,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1a8,2,
             (this->super_Class).cls,0x300,1,4);
  local_1aa = 0;
  local_88 = this_05;
  this_06 = (MthdBitmapFormat *)operator_new(0x25950);
  local_1d2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"bitmap_format",&local_1d1);
  MthdBitmapFormat::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1d0,3,
             (this->super_Class).cls,0x304,1,4);
  local_1d2 = 0;
  local_80 = this_06;
  this_07 = (MthdPatternShape *)operator_new(0x25950);
  local_1fa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"pattern_shape",&local_1f9);
  MthdPatternShape::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1f8,4,
             (this->super_Class).cls,0x308,1,4);
  local_1fa = 0;
  local_78 = this_07;
  this_08 = (MthdPatternSelect *)operator_new(0x25950);
  local_222 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"pattern_select",&local_221);
  MthdPatternSelect::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_220,5,
             (this->super_Class).cls,0x30c,1,4);
  local_222 = 0;
  local_70 = this_08;
  pMVar2 = (MthdPatternBitmapColor *)operator_new(0x25958);
  local_24a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"pattern_bitmap_color_0",&local_249);
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_248,6,
             (this->super_Class).cls,0x310,0);
  local_24a = 0;
  local_68 = pMVar2;
  pMVar2 = (MthdPatternBitmapColor *)operator_new(0x25958);
  local_272 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"pattern_bitmap_color_1",&local_271);
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_270,7,
             (this->super_Class).cls,0x314,1);
  local_272 = 0;
  local_60 = pMVar2;
  pMVar3 = (MthdPatternBitmap *)operator_new(0x25958);
  local_29a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"pattern_bitmap_0",&local_299);
  MthdPatternBitmap::MthdPatternBitmap
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_298,8,
             (this->super_Class).cls,0x318,0);
  local_29a = 0;
  local_58 = pMVar3;
  pMVar3 = (MthdPatternBitmap *)operator_new(0x25958);
  local_2c2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"pattern_bitmap_1",&local_2c1);
  MthdPatternBitmap::MthdPatternBitmap
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2c0,9,
             (this->super_Class).cls,0x31c,1);
  local_2c2 = 0;
  local_50 = pMVar3;
  this_09 = (MthdPatternColorY8 *)operator_new(0x25950);
  local_2ea = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"pattern_color_y8",&local_2e9);
  MthdPatternColorY8::SingleMthdTest
            (this_09,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2e8,10,
             (this->super_Class).cls,0x400,0x10,4);
  local_2ea = 0;
  local_48 = this_09;
  this_10 = (MthdPatternColorR5G6B5 *)operator_new(0x25950);
  local_312 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"pattern_color_r5g6b5",&local_311);
  MthdPatternColorR5G6B5::SingleMthdTest
            (this_10,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_310,0xc,
             (this->super_Class).cls,0x500,0x20,4);
  local_312 = 0;
  local_40 = this_10;
  this_11 = (MthdPatternColorR5G5B5 *)operator_new(0x25950);
  local_33a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"pattern_color_r5g5b5",&local_339);
  MthdPatternColorR5G5B5::SingleMthdTest
            (this_11,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_338,0xb,
             (this->super_Class).cls,0x600,0x20,4);
  local_33a = 0;
  local_38 = this_11;
  this_12 = (MthdPatternColorR8G8B8 *)operator_new(0x25950);
  local_362 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"pattern_color_r8g8b8",&local_361);
  MthdPatternColorR8G8B8::SingleMthdTest
            (this_12,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_360,0xd,
             (this->super_Class).cls,0x700,0x40,4);
  local_362 = 0;
  local_28 = &local_b0;
  local_20 = 0x11;
  local_30 = this_12;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_363);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_363);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_363);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> CPattern::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdCtxFormat(opt, rnd(), "format", 2, cls, 0x300),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 3, cls, 0x304),
		new MthdPatternShape(opt, rnd(), "pattern_shape", 4, cls, 0x308),
		new MthdPatternSelect(opt, rnd(), "pattern_select", 5, cls, 0x30c),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_0", 6, cls, 0x310, 0),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_1", 7, cls, 0x314, 1),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_0", 8, cls, 0x318, 0),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_1", 9, cls, 0x31c, 1),
		new MthdPatternColorY8(opt, rnd(), "pattern_color_y8", 10, cls, 0x400, 0x10),
		new MthdPatternColorR5G6B5(opt, rnd(), "pattern_color_r5g6b5", 12, cls, 0x500, 0x20),
		new MthdPatternColorR5G5B5(opt, rnd(), "pattern_color_r5g5b5", 11, cls, 0x600, 0x20),
		new MthdPatternColorR8G8B8(opt, rnd(), "pattern_color_r8g8b8", 13, cls, 0x700, 0x40),
	};
}